

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcm.c
# Opt level: O1

int mbedtls_gcm_crypt_and_tag
              (mbedtls_gcm_context *ctx,int mode,size_t length,uchar *iv,size_t iv_len,uchar *add,
              size_t add_len,uchar *input,uchar *output,size_t tag_len,uchar *tag)

{
  int iVar1;
  
  iVar1 = mbedtls_gcm_starts(ctx,mode,iv,iv_len,add,add_len);
  if (iVar1 == 0) {
    iVar1 = mbedtls_gcm_update(ctx,length,input,output);
    if (iVar1 == 0) {
      iVar1 = mbedtls_gcm_finish(ctx,tag,tag_len);
      return iVar1;
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_gcm_crypt_and_tag( mbedtls_gcm_context *ctx,
                       int mode,
                       size_t length,
                       const unsigned char *iv,
                       size_t iv_len,
                       const unsigned char *add,
                       size_t add_len,
                       const unsigned char *input,
                       unsigned char *output,
                       size_t tag_len,
                       unsigned char *tag )
{
    int ret;

    if( ( ret = mbedtls_gcm_starts( ctx, mode, iv, iv_len, add, add_len ) ) != 0 )
        return( ret );

    if( ( ret = mbedtls_gcm_update( ctx, length, input, output ) ) != 0 )
        return( ret );

    if( ( ret = mbedtls_gcm_finish( ctx, tag, tag_len ) ) != 0 )
        return( ret );

    return( 0 );
}